

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String __thiscall
doctest::detail::stringifyBinaryExpr<signed_char,int>(detail *this,char *lhs,char *op,int *rhs)

{
  char buf [64];
  String local_98;
  String local_90;
  void *local_88;
  String local_80;
  char local_78 [72];
  
  StringMakerBase<true>::convert<signed_char>((StringMakerBase<true> *)&local_88,lhs);
  String::String(&local_90,op);
  String::operator+(&local_80,(String *)&local_88);
  sprintf(local_78,"%d",(ulong)(uint)*rhs);
  String::String(&local_98,local_78);
  String::operator+((String *)this,&local_80);
  free(local_98.m_str);
  free(local_80.m_str);
  free(local_90.m_str);
  free(local_88);
  return (String)(char *)this;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return toString(lhs) + op + toString(rhs);
    }